

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O0

bool __thiscall ACTable::UpdateFDIs(ACTable *this,string *_filter)

{
  bool bVar1;
  __type _Var2;
  ulong uVar3;
  reference ppVar4;
  LTAircraft *this_00;
  string *in_RSI;
  vector<FDInfo,_std::allocator<FDInfo>_> *in_RDI;
  FDInfo *fdi_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<FDInfo,_std::allocator<FDInfo>_> *__range1_1;
  FDInfo fdi;
  value_type *p;
  iterator __end1;
  iterator __begin1;
  mapLTFlightDataTy *__range1;
  vector<FDInfo,_std::allocator<FDInfo>_> vecAgain;
  bool bHideStatic;
  undefined4 in_stack_fffffffffffff988;
  float in_stack_fffffffffffff98c;
  undefined4 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff994;
  undefined1 in_stack_fffffffffffff995;
  undefined1 in_stack_fffffffffffff996;
  undefined1 in_stack_fffffffffffff997;
  FDInfo *in_stack_fffffffffffff998;
  undefined7 in_stack_fffffffffffff9a0;
  undefined1 in_stack_fffffffffffff9a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9a8;
  undefined7 in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b7;
  pointer *__n;
  LTFlightData *in_stack_fffffffffffff9c8;
  FDInfo *in_stack_fffffffffffff9d0;
  __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_> local_628;
  string *in_stack_fffffffffffff9e0;
  string *_s;
  FDInfo *in_stack_fffffffffffff9e8;
  _Self local_50;
  _Self local_48;
  mapLTFlightDataTy *local_40;
  string local_38;
  string *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  bVar1 = CheckEverySoOften((float *)CONCAT17(in_stack_fffffffffffff997,
                                              CONCAT16(in_stack_fffffffffffff996,
                                                       CONCAT15(in_stack_fffffffffffff995,
                                                                CONCAT14(in_stack_fffffffffffff994,
                                                                         in_stack_fffffffffffff990))
                                                      )),in_stack_fffffffffffff98c);
  if (((bVar1) ||
      (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffff9b7,in_stack_fffffffffffff9b0),
                               in_stack_fffffffffffff9a8), !_Var2)) ||
     ((*(byte *)&(in_RDI->super__Vector_base<FDInfo,_std::allocator<FDInfo>_>)._M_impl.
                 super__Vector_impl_data._M_start & 1) !=
      (*(byte *)&in_RDI[3].super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
                 super__Vector_impl_data._M_start & 1))) {
    std::__cxx11::string::operator=
              ((string *)
               &in_RDI[1].super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_18);
    *(byte *)&in_RDI[3].super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
              super__Vector_impl_data._M_start =
         *(byte *)&(in_RDI->super__Vector_base<FDInfo,_std::allocator<FDInfo>_>)._M_impl.
                   super__Vector_impl_data._M_start & 1;
    std::vector<FDInfo,_std::allocator<FDInfo>_>::clear
              ((vector<FDInfo,_std::allocator<FDInfo>_> *)0x127a16);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      __n = &(in_RDI->super__Vector_base<FDInfo,_std::allocator<FDInfo>_>)._M_impl.
             super__Vector_impl_data._M_finish;
      std::
      map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
      ::size((map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
              *)0x127a44);
      std::vector<FDInfo,_std::allocator<FDInfo>_>::reserve(in_RDI,(size_type)__n);
    }
    local_38.field_2._M_local_buf[0xf] = DataRefs::GetHideStaticTwr(&dataRefs);
    std::vector<FDInfo,_std::allocator<FDInfo>_>::vector
              ((vector<FDInfo,_std::allocator<FDInfo>_> *)0x127a73);
    local_40 = &mapFd;
    local_48._M_node =
         (_Base_ptr)
         std::
         map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
         ::begin((map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                  *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    local_50._M_node =
         (_Base_ptr)
         std::
         map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
         ::end((map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    while (bVar1 = std::operator!=(&local_48,&local_50), bVar1) {
      ppVar4 = std::_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::
               operator*((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_> *
                         )CONCAT17(in_stack_fffffffffffff997,
                                   CONCAT16(in_stack_fffffffffffff996,
                                            CONCAT15(in_stack_fffffffffffff995,
                                                     CONCAT14(in_stack_fffffffffffff994,
                                                              in_stack_fffffffffffff990)))));
      if (((ulong)(in_RDI->super__Vector_base<FDInfo,_std::allocator<FDInfo>_>)._M_impl.
                  super__Vector_impl_data._M_start & 1) == 0) {
LAB_00127b5b:
        if ((local_38.field_2._M_local_buf[0xf] & 1U) != 0) {
          in_stack_fffffffffffff998 = (FDInfo *)LTFlightData::GetUnsafeStat(&ppVar4->second);
          in_stack_fffffffffffff997 =
               LTFlightData::FDStaticData::isStaticObject((FDStaticData *)0x127b87);
          if ((bool)in_stack_fffffffffffff997) goto LAB_00127c4d;
        }
        FDInfo::FDInfo(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
        in_stack_fffffffffffff996 = FDInfo::upToDate((FDInfo *)&stack0xfffffffffffff9e8);
        if ((bool)in_stack_fffffffffffff996) {
          in_stack_fffffffffffff995 =
               FDInfo::matches(in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
          if ((bool)in_stack_fffffffffffff995) {
            std::vector<FDInfo,_std::allocator<FDInfo>_>::emplace_back<FDInfo>
                      ((vector<FDInfo,_std::allocator<FDInfo>_> *)
                       CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                       in_stack_fffffffffffff998);
          }
        }
        else {
          std::vector<FDInfo,_std::allocator<FDInfo>_>::emplace_back<FDInfo>
                    ((vector<FDInfo,_std::allocator<FDInfo>_> *)
                     CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                     in_stack_fffffffffffff998);
        }
        FDInfo::~FDInfo((FDInfo *)
                        CONCAT17(in_stack_fffffffffffff997,
                                 CONCAT16(in_stack_fffffffffffff996,
                                          CONCAT15(in_stack_fffffffffffff995,
                                                   CONCAT14(in_stack_fffffffffffff994,
                                                            in_stack_fffffffffffff990)))));
      }
      else {
        bVar1 = LTFlightData::hasAc(&ppVar4->second);
        if (bVar1) {
          this_00 = LTFlightData::GetAircraft(&ppVar4->second);
          in_stack_fffffffffffff9a7 = XPMP2::Aircraft::IsVisible(&this_00->super_Aircraft);
          if ((bool)in_stack_fffffffffffff9a7) goto LAB_00127b5b;
        }
      }
LAB_00127c4d:
      std::_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_> *)
                 CONCAT17(in_stack_fffffffffffff997,
                          CONCAT16(in_stack_fffffffffffff996,
                                   CONCAT15(in_stack_fffffffffffff995,
                                            CONCAT14(in_stack_fffffffffffff994,
                                                     in_stack_fffffffffffff990)))));
    }
    _s = &local_38;
    local_628._M_current =
         (FDInfo *)
         std::vector<FDInfo,_std::allocator<FDInfo>_>::begin
                   ((vector<FDInfo,_std::allocator<FDInfo>_> *)
                    CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    std::vector<FDInfo,_std::allocator<FDInfo>_>::end
              ((vector<FDInfo,_std::allocator<FDInfo>_> *)
               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>
                               *)CONCAT17(in_stack_fffffffffffff997,
                                          CONCAT16(in_stack_fffffffffffff996,
                                                   CONCAT15(in_stack_fffffffffffff995,
                                                            CONCAT14(in_stack_fffffffffffff994,
                                                                     in_stack_fffffffffffff990)))),
                              (__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>
                               *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988)),
          bVar1) {
      __gnu_cxx::__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>::
      operator*(&local_628);
      FDInfo::Update(in_stack_fffffffffffff998);
      in_stack_fffffffffffff994 = FDInfo::matches(in_stack_fffffffffffff9e8,_s);
      if ((bool)in_stack_fffffffffffff994) {
        std::vector<FDInfo,_std::allocator<FDInfo>_>::emplace_back<FDInfo>
                  ((vector<FDInfo,_std::allocator<FDInfo>_> *)
                   CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0),
                   in_stack_fffffffffffff998);
      }
      __gnu_cxx::__normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_>::
      operator++(&local_628);
    }
    local_1 = 1;
    std::vector<FDInfo,_std::allocator<FDInfo>_>::~vector
              ((vector<FDInfo,_std::allocator<FDInfo>_> *)
               CONCAT17(in_stack_fffffffffffff9a7,in_stack_fffffffffffff9a0));
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ACTable::UpdateFDIs (const std::string& _filter)
{
    // short-cut in case of no change
    if (!CheckEverySoOften(lastUpdate, ACT_AC_UPDATE_PERIOD) &&
        _filter == filterInUse &&
        bFilterAcOnly == bAcOnlyInUse)
        return false;
    filterInUse = _filter;
    bAcOnlyInUse = bFilterAcOnly;
    
    // Walk all aircraft, test for match, then add
    vecFDI.clear();
    if (filterInUse.empty())        // reserve storage (if no filter defined)
        vecFDI.reserve(mapFd.size());
    
    // First pass: Add all matching and remember those we couldn't get
    const bool bHideStatic = dataRefs.GetHideStaticTwr();
    std::vector<FDInfo> vecAgain;
    for (const mapLTFlightDataTy::value_type& p: mapFd) {
        // First filter: Visible a/c only?
        if (bFilterAcOnly && (!p.second.hasAc() || !p.second.GetAircraft()->IsVisible()))
            continue;
        // 2nd filter: Don't show static objects
        if (bHideStatic && p.second.GetUnsafeStat().isStaticObject())
            continue;
        // others: test if filter matches
        FDInfo fdi(p.second);
        if (fdi.upToDate()) {
            if (fdi.matches(filterInUse))
                vecFDI.emplace_back(std::move(fdi));
        } else {
            vecAgain.emplace_back(std::move(fdi));
        }
    }
    
    // Second pass: Try those again, which couldn't yet fully update
    for (FDInfo& fdi: vecAgain) {
        fdi.Update();
        if (fdi.matches(filterInUse))
            vecFDI.emplace_back(std::move(fdi));
    }
    
    // Did do an update
    return true;
}